

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
moveToAlgebraic_abi_cxx11_(move change)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  undefined4 in_ESI;
  undefined5 in_register_0000003b;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [55];
  allocator local_39;
  string local_38 [8];
  string extra;
  move change_local;
  
  bVar3 = (byte)((uint)in_ESI >> 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if ((1 < bVar3) && (bVar3 < 10)) {
    uVar2 = bVar3 - 1;
    if ((int)uVar2 < 0) {
      uVar2 = bVar3 + 2;
    }
    iVar1 = (bVar3 - 1) - (uVar2 & 0xfffffffc);
    if (iVar1 == 1) {
      std::__cxx11::string::operator=(local_38,"q");
    }
    else if (iVar1 == 2) {
      std::__cxx11::string::operator=(local_38,"r");
    }
    else if (iVar1 == 3) {
      std::__cxx11::string::operator=(local_38,"n");
    }
    else {
      std::__cxx11::string::operator=(local_38,"b");
    }
  }
  squareToAlgebraic_abi_cxx11_((byte)local_90);
  squareToAlgebraic_abi_cxx11_((byte)local_b0);
  std::operator+(local_70,local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT53(in_register_0000003b,change),local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_38);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT53(in_register_0000003b,change);
}

Assistant:

std::string moveToAlgebraic(const move change) {
  std::string extra = "";
  if(change.special >= 2 && change.special <= 9) {
    switch((change.special - 1) % 4) {
      case 1:
        extra = "q";
        break;
      case 2:
        extra = "r";
        break;
      case 3:
        extra = "n";
        break;
      default:
        extra = "b";
        break;
    }
  }
  return squareToAlgebraic(change.start) + squareToAlgebraic(change.end) + extra;
}